

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::ScaleLayerParams::_internal_add_shapescale
          (ScaleLayerParams *this,uint64_t value)

{
  uint64_t local_8;
  
  local_8 = value;
  google::protobuf::RepeatedField<unsigned_long>::Add(&this->shapescale_,&local_8);
  return;
}

Assistant:

inline void ScaleLayerParams::_internal_add_shapescale(uint64_t value) {
  shapescale_.Add(value);
}